

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiled.cpp
# Opt level: O0

void __thiscall
Rml::DecoratorTiledInstancer::RegisterTileProperty
          (DecoratorTiledInstancer *this,String *name,bool register_fit_modes)

{
  String *shorthand_name;
  PropertyId PVar1;
  undefined8 uVar2;
  PropertyDefinition *pPVar3;
  char *format;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  String local_4a8;
  allocator<char> local_481;
  String local_480;
  allocator<char> local_459;
  String local_458;
  allocator<char> local_431;
  String local_430;
  String local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  allocator<char> local_349;
  String local_348;
  allocator<char> local_321;
  String local_320;
  allocator<char> local_2f9;
  String local_2f8;
  allocator<char> local_2d1;
  String local_2d0;
  allocator<char> local_2a9;
  String local_2a8;
  undefined1 local_288 [8];
  String align_y_name;
  String local_260;
  allocator<char> local_239;
  String local_238;
  allocator<char> local_211;
  String local_210;
  allocator<char> local_1e9;
  String local_1e8;
  allocator<char> local_1c1;
  String local_1c0;
  undefined1 local_1a0 [8];
  String align_x_name;
  String local_178;
  allocator<char> local_151;
  String local_150;
  allocator<char> local_129;
  String local_128;
  undefined1 local_108 [8];
  String fit_name;
  String additional_modes;
  String local_c0;
  allocator<char> local_99;
  String local_98;
  allocator<char> local_61;
  String local_60;
  String local_40;
  value_type local_20;
  byte local_19;
  TilePropertyIds ids;
  bool register_fit_modes_local;
  String *name_local;
  DecoratorTiledInstancer *this_local;
  
  local_20.orientation = Invalid;
  local_20.src = Invalid;
  local_20.fit = Invalid;
  local_20.align_x = Invalid;
  local_20.align_y = Invalid;
  local_19 = register_fit_modes;
  _ids = name;
  uVar2 = ::std::__cxx11::string::c_str();
  CreateString_abi_cxx11_(&local_40,"%s-src",uVar2);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
  pPVar3 = EffectSpecification::RegisterProperty
                     (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_40,
                      &local_60);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"string",&local_99);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"",(allocator<char> *)(additional_modes.field_2._M_local_buf + 0xf)
            );
  pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_98,&local_c0);
  PVar1 = PropertyDefinition::GetId(pPVar3);
  local_20.src = PVar1;
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::allocator<char>::~allocator
            ((allocator<char> *)(additional_modes.field_2._M_local_buf + 0xf));
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::allocator<char>::~allocator(&local_99);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::allocator<char>::~allocator(&local_61);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::string((string *)(fit_name.field_2._M_local_buf + 8));
  if ((local_19 & 1) != 0) {
    uVar2 = ::std::__cxx11::string::c_str();
    CreateString_abi_cxx11_((String *)local_108,"%s-fit",uVar2);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"fill",&local_129);
    pPVar3 = EffectSpecification::RegisterProperty
                       (&(this->super_DecoratorInstancer).super_EffectSpecification,
                        (String *)local_108,&local_128);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"keyword",&local_151);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,
               "fill, contain, cover, scale-none, scale-down, repeat, repeat-x, repeat-y",
               (allocator<char> *)(align_x_name.field_2._M_local_buf + 0xf));
    pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_150,&local_178);
    PVar1 = PropertyDefinition::GetId(pPVar3);
    local_20.fit = PVar1;
    ::std::__cxx11::string::~string((string *)&local_178);
    ::std::allocator<char>::~allocator((allocator<char> *)(align_x_name.field_2._M_local_buf + 0xf))
    ;
    ::std::__cxx11::string::~string((string *)&local_150);
    ::std::allocator<char>::~allocator(&local_151);
    ::std::__cxx11::string::~string((string *)&local_128);
    ::std::allocator<char>::~allocator(&local_129);
    uVar2 = ::std::__cxx11::string::c_str();
    CreateString_abi_cxx11_((String *)local_1a0,"%s-align-x",uVar2);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"center",&local_1c1);
    pPVar3 = EffectSpecification::RegisterProperty
                       (&(this->super_DecoratorInstancer).super_EffectSpecification,
                        (String *)local_1a0,&local_1c0);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"keyword",&local_1e9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"left, center, right",&local_211);
    pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_1e8,&local_210);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"length_percent",&local_239);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"",(allocator<char> *)(align_y_name.field_2._M_local_buf + 0xf))
    ;
    pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_238,&local_260);
    PVar1 = PropertyDefinition::GetId(pPVar3);
    local_20.align_x = PVar1;
    ::std::__cxx11::string::~string((string *)&local_260);
    ::std::allocator<char>::~allocator((allocator<char> *)(align_y_name.field_2._M_local_buf + 0xf))
    ;
    ::std::__cxx11::string::~string((string *)&local_238);
    ::std::allocator<char>::~allocator(&local_239);
    ::std::__cxx11::string::~string((string *)&local_210);
    ::std::allocator<char>::~allocator(&local_211);
    ::std::__cxx11::string::~string((string *)&local_1e8);
    ::std::allocator<char>::~allocator(&local_1e9);
    ::std::__cxx11::string::~string((string *)&local_1c0);
    ::std::allocator<char>::~allocator(&local_1c1);
    uVar2 = ::std::__cxx11::string::c_str();
    CreateString_abi_cxx11_((String *)local_288,"%s-align-y",uVar2);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"center",&local_2a9);
    pPVar3 = EffectSpecification::RegisterProperty
                       (&(this->super_DecoratorInstancer).super_EffectSpecification,
                        (String *)local_288,&local_2a8);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"keyword",&local_2d1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"top, center, bottom",&local_2f9);
    pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_2d0,&local_2f8);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"length_percent",&local_321);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"",&local_349);
    pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_320,&local_348);
    PVar1 = PropertyDefinition::GetId(pPVar3);
    local_20.align_y = PVar1;
    ::std::__cxx11::string::~string((string *)&local_348);
    ::std::allocator<char>::~allocator(&local_349);
    ::std::__cxx11::string::~string((string *)&local_320);
    ::std::allocator<char>::~allocator(&local_321);
    ::std::__cxx11::string::~string((string *)&local_2f8);
    ::std::allocator<char>::~allocator(&local_2f9);
    ::std::__cxx11::string::~string((string *)&local_2d0);
    ::std::allocator<char>::~allocator(&local_2d1);
    ::std::__cxx11::string::~string((string *)&local_2a8);
    ::std::allocator<char>::~allocator(&local_2a9);
    ::std::operator+(&local_3f0,", ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
    ;
    ::std::operator+(&local_3d0,&local_3f0,", ");
    ::std::operator+(&local_3b0,&local_3d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0)
    ;
    ::std::operator+(&local_390,&local_3b0,", ");
    ::std::operator+(&local_370,&local_390,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288)
    ;
    ::std::__cxx11::string::operator+=
              ((string *)(fit_name.field_2._M_local_buf + 8),(string *)&local_370);
    ::std::__cxx11::string::~string((string *)&local_370);
    ::std::__cxx11::string::~string((string *)&local_390);
    ::std::__cxx11::string::~string((string *)&local_3b0);
    ::std::__cxx11::string::~string((string *)&local_3d0);
    ::std::__cxx11::string::~string((string *)&local_3f0);
    ::std::__cxx11::string::~string((string *)local_288);
    ::std::__cxx11::string::~string((string *)local_1a0);
    ::std::__cxx11::string::~string((string *)local_108);
  }
  uVar2 = ::std::__cxx11::string::c_str();
  CreateString_abi_cxx11_(&local_410,"%s-orientation",uVar2);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"none",&local_431);
  pPVar3 = EffectSpecification::RegisterProperty
                     (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_410,
                      &local_430);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"keyword",&local_459);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"none, flip-horizontal, flip-vertical, rotate-180",&local_481);
  pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_458,&local_480);
  local_20.orientation = PropertyDefinition::GetId(pPVar3);
  ::std::__cxx11::string::~string((string *)&local_480);
  ::std::allocator<char>::~allocator(&local_481);
  ::std::__cxx11::string::~string((string *)&local_458);
  ::std::allocator<char>::~allocator(&local_459);
  ::std::__cxx11::string::~string((string *)&local_430);
  ::std::allocator<char>::~allocator(&local_431);
  ::std::__cxx11::string::~string((string *)&local_410);
  shorthand_name = _ids;
  ::std::operator+(&local_4c8,"%s-src, %s-orientation",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&fit_name.field_2 + 8));
  format = (char *)::std::__cxx11::string::c_str();
  uVar2 = ::std::__cxx11::string::c_str();
  uVar4 = ::std::__cxx11::string::c_str();
  uVar5 = ::std::__cxx11::string::c_str();
  uVar6 = ::std::__cxx11::string::c_str();
  uVar7 = ::std::__cxx11::string::c_str();
  uVar8 = ::std::__cxx11::string::c_str();
  CreateString_abi_cxx11_(&local_4a8,format,uVar2,uVar4,uVar5,uVar6,uVar7,uVar8);
  EffectSpecification::RegisterShorthand
            (&(this->super_DecoratorInstancer).super_EffectSpecification,shorthand_name,&local_4a8,
             FallThrough);
  ::std::__cxx11::string::~string((string *)&local_4a8);
  ::std::__cxx11::string::~string((string *)&local_4c8);
  ::std::
  vector<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
  ::push_back(&this->tile_property_ids,&local_20);
  ::std::__cxx11::string::~string((string *)(fit_name.field_2._M_local_buf + 8));
  return;
}

Assistant:

void DecoratorTiledInstancer::RegisterTileProperty(const String& name, bool register_fit_modes)
{
	TilePropertyIds ids = {};

	ids.src = RegisterProperty(CreateString("%s-src", name.c_str()), "").AddParser("string").GetId();

	String additional_modes;

	if (register_fit_modes)
	{
		String fit_name = CreateString("%s-fit", name.c_str());
		ids.fit = RegisterProperty(fit_name, "fill")
					  .AddParser("keyword", "fill, contain, cover, scale-none, scale-down, repeat, repeat-x, repeat-y")
					  .GetId();

		String align_x_name = CreateString("%s-align-x", name.c_str());
		ids.align_x = RegisterProperty(align_x_name, "center").AddParser("keyword", "left, center, right").AddParser("length_percent").GetId();

		String align_y_name = CreateString("%s-align-y", name.c_str());
		ids.align_y = RegisterProperty(align_y_name, "center").AddParser("keyword", "top, center, bottom").AddParser("length_percent").GetId();

		additional_modes += ", " + fit_name + ", " + align_x_name + ", " + align_y_name;
	}

	ids.orientation = RegisterProperty(CreateString("%s-orientation", name.c_str()), "none")
						  .AddParser("keyword", "none, flip-horizontal, flip-vertical, rotate-180")
						  .GetId();

	RegisterShorthand(name,
		CreateString(("%s-src, %s-orientation" + additional_modes).c_str(), name.c_str(), name.c_str(), name.c_str(), name.c_str(), name.c_str(),
			name.c_str()),
		ShorthandType::FallThrough);

	tile_property_ids.push_back(ids);
}